

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O2

void CombinationKeygenRecurse<unsigned_int,unsigned_long>
               (unsigned_long *key,int len,int maxlen,unsigned_long *blocks,int blockcount,
               pfHash hash,vector<unsigned_int,_std::allocator<unsigned_int>_> *hashes)

{
  ulong uVar1;
  uint h;
  value_type_conflict2 local_34;
  
  if (len != maxlen) {
    for (uVar1 = 0; (uint)(~(blockcount >> 0x1f) & blockcount) != uVar1; uVar1 = uVar1 + 1) {
      key[len] = blocks[uVar1];
      (*hash)(key,len * 8 + 8,0,&local_34);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(hashes,&local_34);
      CombinationKeygenRecurse<unsigned_int,unsigned_long>
                (key,len + 1,maxlen,blocks,blockcount,hash,hashes);
    }
  }
  return;
}

Assistant:

void CombinationKeygenRecurse ( blocktype * key, int len, int maxlen,
                  blocktype * blocks, int blockcount,
                  pfHash hash, std::vector<hashtype> & hashes )
{
  if(len == maxlen) return;  // end recursion

  for(int i = 0; i < blockcount; i++)
  {
    key[len] = blocks[i];

    //if(len == maxlen-1)
    {
      hashtype h;
      hash(key, (len+1) * sizeof(blocktype), 0, &h);
      hashes.push_back(h);
    }

    //else
    {
      CombinationKeygenRecurse(key,len+1,maxlen,blocks,blockcount,hash,hashes);
    }
  }
}